

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

int nk_input_has_mouse_click_in_rect(nk_input *i,nk_buttons id,nk_rect b)

{
  float fVar1;
  uint uVar2;
  
  uVar2 = 0;
  if (i != (nk_input *)0x0) {
    fVar1 = (i->mouse).buttons[id].clicked_pos.x;
    uVar2 = 0;
    if ((b.x <= fVar1) && (fVar1 < b.x + b.w)) {
      fVar1 = (i->mouse).buttons[id].clicked_pos.y;
      uVar2 = -(uint)(b.y <= fVar1 && fVar1 < b.h + b.y) & 1;
    }
  }
  return uVar2;
}

Assistant:

NK_API int
nk_input_has_mouse_click_in_rect(const struct nk_input *i, enum nk_buttons id,
    struct nk_rect b)
{
    const struct nk_mouse_button *btn;
    if (!i) return nk_false;
    btn = &i->mouse.buttons[id];
    if (!NK_INBOX(btn->clicked_pos.x,btn->clicked_pos.y,b.x,b.y,b.w,b.h))
        return nk_false;
    return nk_true;
}